

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::
format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
::on_text(format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
          *this,wchar_t *begin,wchar_t *end)

{
  buffer<wchar_t> *pbVar1;
  size_t sVar2;
  buffer<wchar_t> *c;
  ulong uVar3;
  
  pbVar1 = (this->context).out_.container;
  sVar2 = pbVar1->size_;
  uVar3 = ((long)end - (long)begin >> 2) + sVar2;
  if (pbVar1->capacity_ < uVar3) {
    (**pbVar1->_vptr_buffer)(pbVar1,uVar3);
  }
  pbVar1->size_ = uVar3;
  if (end != begin) {
    memmove(pbVar1->ptr_ + sVar2,begin,(long)end - (long)begin);
  }
  (this->context).out_.container = pbVar1;
  return;
}

Assistant:

void on_text(const Char* begin, const Char* end) {
    auto size = internal::to_unsigned(end - begin);
    auto out = context.out();
    auto&& it = internal::reserve(out, size);
    it = std::copy_n(begin, size, it);
    context.advance_to(out);
  }